

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O2

InterruptResult * __thiscall
node::KernelNotifications::blockTip
          (InterruptResult *__return_storage_ptr__,KernelNotifications *this,
          SynchronizationState state,CBlockIndex *index)

{
  bool bVar1;
  undefined4 in_register_00000014;
  CBlockIndex *this_00;
  InterruptResult *pIVar2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  uint256 local_58;
  long local_38;
  
  this_00 = (CBlockIndex *)CONCAT44(in_register_00000014,state);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = (InterruptResult *)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock3,(AnnotatedMixin<std::mutex> *)(__return_storage_ptr__ + 8),
             "m_tip_block_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/kernel_notifications.cpp"
             ,0x36,false);
  CBlockIndex::GetBlockHash(&local_58,this_00);
  *(undefined8 *)(__return_storage_ptr__ + 0x3c) =
       local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)(__return_storage_ptr__ + 0x40) =
       local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)(__return_storage_ptr__ + 0x34) =
       local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)(__return_storage_ptr__ + 0x38) =
       local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock3.super_unique_lock);
  CClientUIInterface::NotifyBlockTip
            ((CClientUIInterface *)&uiInterface,(SynchronizationState)this,this_00);
  if ((*(int *)(__return_storage_ptr__ + 4) != 0) &&
     (*(int *)(__return_storage_ptr__ + 4) <= this_00->nHeight)) {
    bVar1 = util::SignalInterrupt::operator()(*(SignalInterrupt **)(__return_storage_ptr__ + 0x44));
    pIVar2 = (InterruptResult *)0x100;
    if (!bVar1) {
      logging_function._M_str = "blockTip";
      logging_function._M_len = 8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/kernel_notifications.cpp"
      ;
      source_file._M_len = 0x6d;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x3e,ALL,Error,(ConstevalFormatString<0U>)0x6a6ec8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pIVar2;
  }
  __stack_chk_fail();
}

Assistant:

kernel::InterruptResult KernelNotifications::blockTip(SynchronizationState state, CBlockIndex& index)
{
    {
        LOCK(m_tip_block_mutex);
        m_tip_block = index.GetBlockHash();
        m_tip_block_cv.notify_all();
    }

    uiInterface.NotifyBlockTip(state, &index);
    if (m_stop_at_height && index.nHeight >= m_stop_at_height) {
        if (!m_shutdown()) {
            LogError("Failed to send shutdown signal after reaching stop height\n");
        }
        return kernel::Interrupted{};
    }
    return {};
}